

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall QLocale::nativeLanguageName(QString *__return_storage_ptr__,QLocale *this)

{
  QLocaleData *pQVar1;
  QSystemLocale *pQVar2;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = ((this->d).d.ptr)->m_data;
  if (pQVar1 == &systemLocaleData) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = systemLocale();
    local_58._16_8_ = 0;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_40 = 2;
    (*pQVar2->_vptr_QSystemLocale[2])(&local_38,pQVar2,0x28);
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_38);
    ::QVariant::~QVariant((QVariant *)&local_38);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_002e324a;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
    pQVar1 = ((this->d).d.ptr)->m_data;
  }
  local_38.shared =
       (PrivateShared *)
       ((ulong)pQVar1->m_endonymLanguage_size << 0x20 | (ulong)pQVar1->m_endonymLanguage_idx);
  QLocaleData::DataRange::getData
            (__return_storage_ptr__,(DataRange *)&local_38.shared,
             L"АԥсшәаҚырҭтәылаQafarOtobbiaYabuutiEretriaAfrikaansSuid-AfrikaNamibiëAghemKàmàlûŋAkanGaanaAkooseKamerûnshqipShqipëriKosovëMaqedonia e Veriutአማርኛኢትዮጵያالعربيةمصرالجزائرالبحرينتشادجزر القمرجيبوتيإريترياالعراقإسرائيلالأردنالكويتلبنانليبياموريتانياالمغربعُمانالأراضي الفلسطينيةقطرالمملكة العربية السعوديةالصومالجنوب السودانالسودانسورياتونسالإمارات العربية المتحدةالصحراء الغربيةالعربية الفصحى الحديثةالعالماليمنaragonésEspanyaհայերենՀայաստանঅসমীয়াভাৰতasturianuEspañaKipareTadhaniaAtsamazərbaycanAzərbaycanتۆرکجهазәрбајҹанАзәрбајҹанrikpakamɛrúnbamanakanMaliবাংলাবাংলাদেশভারতƁàsàaKàmɛ̀rûnбашҡорт телеeuskaraEspainiaбеларускаяБеларусьIchibembaZambiaHibenaHutanzaniaभोजपुरीभारतብሊንኤርትራबर’bosanskiBosna i HercegovinaбосанскиБосна и ХерцеговинаbrezhonegFrañsбългарскиБългарияမြန်မာ粵語中國香港特別行政區粤语中华人民共和国catalàAndorraFrançaItàliaCebuanoPilipinasTamaziɣt n laṭlaṣMeṛṛukکوردیی ناوەندیعێراقئێران𑄌𑄋𑄴𑄟𑄳𑄦𑄝𑄁𑄣𑄘𑄬𑄌𑄴𑄞𑄢𑄧𑄖𑄴нохчийнРоссиᏣᎳᎩᏌᏊ ᎢᏳᎾᎵᏍᏔᏅ ᏍᎦᏚᎩChikashshanompaʼUnited StatesRukigaUganda简体中文中国中国香港特别行政区中国澳门特别行政区马来西亚新加坡繁體中文中國澳門特別行政區馬來西亞台灣церковнослове́нскїйрѡссі́ачӑвашРаҫҫейKölschDoütschlandkernewekRywvaneth UnyscorsuFranciahrvatskiHrvatskačeštinaČeskodanskDanmarkGrønlandދިވެހިބަސްދިވެހި ރާއްޖެडोगरीduáláCamerounNederlandsArubaVlaamsBelgiëCaribisch NederlandCuraçaoSint-MaartenSurinameརྫོང་ཁའབྲུགKĩembuKenyaAmerican English𐐀𐑍𐑊𐐮𐑇𐐏𐐭𐑌𐐴𐐻𐐲𐐼 𐐝𐐻𐐩𐐻𐑅American SamoaAnguillaAntigua & BarbudaAustralian EnglishAustriaBahamasBarbadosBelgiumBelizeBermudaBotswanaBritish Indian Ocean TerritoryBritish Virgin IslandsBurundiCameroonCanadian EnglishCanadaCayman IslandsChristmas IslandCocos (Keeling) IslandsCook IslandsCyprusDenmarkDiego GarciaDominicaEritreaEswatiniEuropeFalkland IslandsFijiFinlandGambiaGermanyGhanaGibraltarGrenadaGuamGuernseyGuyanaHong Kong SAR ChinaIndonesiaIrelandIsle of ManIsraelJamaicaJerseyKiribatiLesothoLiberiaMacao SAR ChinaMadagascarMalawiMalaysiaMaldivesMaltaMarshall IslandsMauritiusMicronesiaMontserratNamibiaNauruNetherlandsNew ZealandNigeriaNiueNorfolk IslandNorthern Mariana IslandsPakistanPalauPapua New GuineaP..." /* TRUNCATED STRING LITERAL */
            );
LAB_002e324a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::nativeLanguageName() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res = systemLocale()->query(QSystemLocale::NativeLanguageName).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    return d->m_data->endonymLanguage().getData(endonyms_data);
}